

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-point.hpp
# Opt level: O2

void diy::Serialization<diy::DynamicPoint<float,_4UL>_>::load(BinaryBuffer *bb,Point *p)

{
  size_t s;
  
  (*bb->_vptr_BinaryBuffer[4])(bb,&s,8);
  itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::resize
            (&p->super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>,s);
  if (s != 0) {
    (*bb->_vptr_BinaryBuffer[4])
              (bb,(p->super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>).m_begin,s << 2);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Point& p)
    {
      size_t s;
      diy::load(bb, s);
      p.resize(s);
      if (s > 0)
        diy::load(bb, &p[0], s);
    }